

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::pivotColumnFtran(HEkk *this,HighsInt iCol,HVector *col_aq)

{
  long in_RDX;
  undefined4 in_ESI;
  HEkk *in_RDI;
  double dVar1;
  double local_col_aq_density;
  HighsInt num_row;
  double in_stack_00000048;
  HighsInt in_stack_00000054;
  HVector *in_stack_00000058;
  HighsSparseMatrix *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc8;
  HighsInt in_stack_ffffffffffffffcc;
  HVector *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffd8);
  HVectorBase<double>::clear((HVectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined1 *)(in_RDX + 0x78) = 1;
  HighsSparseMatrix::collectAj
            (in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000048);
  if (((in_RDI->analysis_).analyse_simplex_summary_data & 1U) != 0) {
    HighsSimplexAnalysis::operationRecordBefore
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
               ,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(HVector *)in_RDI,
               (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  HSimplexNla::ftran((HSimplexNla *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,(double)in_RDI,
                     (HighsTimerClock *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (((in_RDI->analysis_).analyse_simplex_summary_data & 1U) != 0) {
    HighsSimplexAnalysis::operationRecordAfter
              ((HighsSimplexAnalysis *)in_RDI,in_stack_ffffffffffffffcc,(HVector *)0x772764);
  }
  iVar2 = (in_RDI->lp_).num_row_;
  dVar1 = (double)*(int *)(in_RDX + 4) / (double)iVar2;
  updateOperationResultDensity(in_RDI,dVar1,&(in_RDI->info_).col_aq_density);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
             (HighsInt)((ulong)dVar1 >> 0x20),SUB84(dVar1,0));
  return;
}

Assistant:

void HEkk::pivotColumnFtran(const HighsInt iCol, HVector& col_aq) {
  analysis_.simplexTimerStart(FtranClock);
  col_aq.clear();
  col_aq.packFlag = true;
  lp_.a_matrix_.collectAj(col_aq, iCol, 1);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordBefore(kSimplexNlaFtran, col_aq,
                                    info_.col_aq_density);
  simplex_nla_.ftran(col_aq, info_.col_aq_density,
                     analysis_.pointer_serial_factor_clocks);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordAfter(kSimplexNlaFtran, col_aq);
  HighsInt num_row = lp_.num_row_;
  const double local_col_aq_density = (double)col_aq.count / num_row;
  updateOperationResultDensity(local_col_aq_density, info_.col_aq_density);
  analysis_.simplexTimerStop(FtranClock);
}